

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::MarkUsedBlocks(void)

{
  int iVar1;
  ExecutorX86 *pEVar2;
  ExternVarInfo *pEVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  ExternLocalInfo *pEVar7;
  char *pcVar8;
  ulong *puVar9;
  EVP_PKEY_CTX *in_RSI;
  int local_d4;
  markerType *marker;
  uint *basePtr;
  char *ptr_1;
  ExecutorRegVm *exec_3;
  ExecutorX86 *exec_2;
  char *tempStackTop;
  char *tempStackBase;
  char *ptr;
  ExternLocalInfo *lInfo;
  uint i_2;
  uint stackSize;
  int alignOffset;
  ExternFuncInfo *function;
  uint i_1;
  int funcID;
  int *cachedFuncID;
  ExecutorRegVm *exec_1;
  ExecutorX86 *exec;
  uint local_40;
  int address;
  uint currentFrame;
  int offset;
  uint i;
  uint execID;
  void *unknownExec;
  char *symbols;
  ExternTypeInfo *types;
  ExternVarInfo *vars;
  ExternFuncInfo *functions;
  
  vars = *(ExternVarInfo **)(NULLC::commonLinker + 0x240);
  types = *(ExternTypeInfo **)(NULLC::commonLinker + 0x230);
  symbols = *(char **)(NULLC::commonLinker + 0x200);
  unknownExec = *(void **)(NULLC::commonLinker + 0x290);
  HashMap<int>::init((HashMap<int> *)functionIDs,in_RSI);
  HashMap<int>::clear((HashMap<int> *)functionIDs);
  curr = rootsA;
  next = rootsB;
  FastVector<char_*,_false,_false>::clear((FastVector<char_*,_false,_false> *)rootsA);
  FastVector<char_*,_false,_false>::clear((FastVector<char_*,_false,_false> *)next);
  _i = (ExecutorX86 *)0x0;
  uVar4 = nullcGetCurrentExecutor((void **)&i);
  if (uVar4 != 2) {
    for (currentFrame = 0;
        uVar5 = FastVector<ExternVarInfo,_false,_false>::size
                          ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::commonLinker + 0x230))
        , currentFrame < uVar5; currentFrame = currentFrame + 1) {
      CheckVariable(unmanageableBase + (&types->type)[(ulong)currentFrame * 4],
                    (ExternTypeInfo *)
                    (symbols + (ulong)(&types->padding)[(ulong)currentFrame * 4] * 0x50));
    }
  }
  address = *(int *)(NULLC::commonLinker + 0x750);
  local_40 = 0;
  while( true ) {
    exec._4_4_ = 0;
    if (uVar4 == 1) {
      exec._4_4_ = ExecutorX86::GetCallStackAddress(_i,local_40);
      local_40 = local_40 + 1;
    }
    if (uVar4 == 0) {
      exec._4_4_ = ExecutorRegVm::GetCallStackAddress((ExecutorRegVm *)_i,local_40);
      local_40 = local_40 + 1;
    }
    pEVar2 = _i;
    if (exec._4_4_ == 0) break;
    puVar6 = (uint *)HashMap<int>::find((HashMap<int> *)functionIDs,exec._4_4_);
    function._4_4_ = 0xffffffff;
    if (puVar6 == (uint *)0x0) {
      for (function._0_4_ = 0;
          uVar5 = FastVector<ExternFuncInfo,_false,_false>::size
                            ((FastVector<ExternFuncInfo,_false,_false> *)
                             (NULLC::commonLinker + 0x240)), (uint)function < uVar5;
          function._0_4_ = (uint)function + 1) {
        if ((*(int *)((long)vars + (ulong)(uint)function * 0x94 + 4) <= (int)exec._4_4_) &&
           ((int)exec._4_4_ <
            *(int *)((long)vars + (ulong)(uint)function * 0x94 + 4) +
            *(int *)((long)vars + (ulong)(uint)function * 0x94 + 8))) {
          function._4_4_ = (uint)function;
        }
      }
      HashMap<int>::insert((HashMap<int> *)functionIDs,exec._4_4_,function._4_4_);
    }
    else {
      function._4_4_ = *puVar6;
    }
    pEVar3 = vars;
    if (function._4_4_ != 0xffffffff) {
      if (address % 0x10 == 0) {
        local_d4 = 0;
      }
      else {
        local_d4 = 0x10 - address % 0x10;
      }
      local_d4 = local_d4 + address;
      iVar1 = *(int *)((long)vars + (long)(int)function._4_4_ * 0x94 + 0x68);
      for (lInfo._4_4_ = 0;
          lInfo._4_4_ < *(uint *)((long)pEVar3 + (long)(int)function._4_4_ * 0x94 + 0x58);
          lInfo._4_4_ = lInfo._4_4_ + 1) {
        pEVar7 = FastVector<ExternLocalInfo,_false,_false>::operator[]
                           ((FastVector<ExternLocalInfo,_false,_false> *)
                            (NULLC::commonLinker + 0x270),
                            *(int *)((long)pEVar3 + (long)(int)function._4_4_ * 0x94 + 0x50) +
                            lInfo._4_4_);
        CheckVariable(unmanageableBase + (ulong)pEVar7->offset + (long)local_d4,
                      (ExternTypeInfo *)(symbols + (ulong)pEVar7->type * 0x50));
      }
      if (*(int *)((long)pEVar3 + (long)(int)function._4_4_ * 0x94 + 0x4c) != -1) {
        CheckPointer(unmanageableBase +
                     (ulong)*(uint *)((long)pEVar3 + (long)(int)function._4_4_ * 0x94 + 100) +
                     (long)local_d4 + -8);
      }
      address = (iVar1 + 0xfU & 0xfffffff0) + local_d4;
    }
  }
  tempStackTop = (char *)0x0;
  exec_2 = (ExecutorX86 *)0x0;
  if (uVar4 == 1) {
    tempStackTop = (char *)ExecutorX86::GetStackStart(_i);
    exec_2 = (ExecutorX86 *)ExecutorX86::GetStackEnd(pEVar2);
  }
  pEVar2 = _i;
  if (uVar4 == 0) {
    tempStackTop = (char *)ExecutorRegVm::GetStackStart((ExecutorRegVm *)_i);
    exec_2 = (ExecutorX86 *)ExecutorRegVm::GetStackEnd((ExecutorRegVm *)pEVar2);
  }
  if (exec_2 < tempStackTop) {
    __assert_fail("tempStackTop >= tempStackBase",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                  ,0x493,"void GC::MarkUsedBlocks()");
  }
  do {
    while( true ) {
      if (exec_2 < (ExecutorX86 *)(tempStackTop + 8)) {
        MarkPendingRoots();
        return;
      }
      pcVar8 = ReadVmMemoryPointer(tempStackTop);
      if (((char *)0x10000 < pcVar8) &&
         (((pcVar8 < unmanageableBase || (unmanageableTop < pcVar8)) &&
          (pcVar8 = (char *)NULLC::GetBasePointer(pcVar8), pcVar8 != (char *)0x0)))) break;
LAB_0014ce55:
      tempStackTop = tempStackTop + 4;
    }
    puVar9 = (ulong *)(pcVar8 + -8);
    if ((*puVar9 & 2) == 0) {
      PrintMarker(*puVar9);
      if ((*puVar9 & 1) == 0) {
        *puVar9 = *puVar9 | 1;
        CheckBasePointer(pcVar8);
      }
      goto LAB_0014ce55;
    }
    tempStackTop = tempStackTop + 4;
  } while( true );
}

Assistant:

void GC::MarkUsedBlocks()
{
	GC_DEBUG_PRINT("Unmanageable range: %p-%p\n", GC::unmanageableBase, GC::unmanageableTop);

	// Get information about programs' functions, variables, types and symbols (for debug output)
	ExternFuncInfo	*functions = NULLC::commonLinker->exFunctions.data;
	ExternVarInfo	*vars = NULLC::commonLinker->exVariables.data;
	ExternTypeInfo	*types = NULLC::commonLinker->exTypes.data;
	char			*symbols = NULLC::commonLinker->exSymbols.data;
	(void)symbols;

	GC::functionIDs.init();
	GC::functionIDs.clear();

	GC::curr = &GC::rootsA;
	GC::next = &GC::rootsB;
	GC::curr->clear();
	GC::next->clear();

	// To check every stack frame, we have to get it first. But we have multiple executors, so flow alternates depending on which executor we are running
	void *unknownExec = NULL;
	unsigned int execID = nullcGetCurrentExecutor(&unknownExec);

	if(execID != NULLC_LLVM)
	{
		// Mark global variables
		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(GC::unmanageableBase + vars[i].offset, types[vars[i].type]);
		}
	}
	else
	{
#ifdef NULLC_LLVM_SUPPORT
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;

		unsigned count = 0;
		char *data = exec->GetVariableData(&count);

		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(data + vars[i].offset, types[vars[i].type]);
		}
#endif
	}

	// Starting stack offset is equal to global variable size
	int offset = NULLC::commonLinker->globalVarSize;

	// Init stack trace
	unsigned currentFrame = 0;

	// Mark local variables
	while(true)
	{
		int address = 0;

		// Get next address from call stack

#ifdef NULLC_BUILD_X86_JIT
		if(execID == NULLC_X86)
		{
			ExecutorX86 *exec = (ExecutorX86*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

#ifdef NULLC_LLVM_SUPPORT
		if(execID == NULLC_LLVM)
		{
			ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

		if(execID == NULLC_REG_VM)
		{
			ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}

		// If failed, exit
		if(address == 0)
			break;

		// Find corresponding function
		int *cachedFuncID = GC::functionIDs.find(address);

		int funcID = -1;
		if(cachedFuncID)
		{
			funcID = *cachedFuncID;
		}
		else
		{
			for(unsigned i = 0; i < NULLC::commonLinker->exFunctions.size(); i++)
			{
				if(address >= functions[i].regVmAddress && address < (functions[i].regVmAddress + functions[i].regVmCodeSize))
					funcID = i;
			}

			GC::functionIDs.insert(address, funcID);
		}

		// If we are not in global scope
		if(funcID != -1)
		{
			ExternFuncInfo &function = functions[funcID];

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;
			GC_DEBUG_PRINT("In function %s (with offset of %d)\n", symbols + function.offsetToName, alignOffset);

			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			// Check every function local
			for(unsigned i = 0; i < function.localCount; i++)
			{
				// Get information about local
				ExternLocalInfo &lInfo = NULLC::commonLinker->exLocals[function.offsetToFirstLocal + i];

				GC_DEBUG_PRINT("Local %s %s (with offset of %d+%d)\n", symbols + types[lInfo.type].offsetToName, symbols + lInfo.offsetToName, offset, lInfo.offset);
				// Check it
				GC::CheckVariable(GC::unmanageableBase + offset + lInfo.offset, types[lInfo.type]);
			}

			if(function.contextType != ~0u)
			{
				GC_DEBUG_PRINT("Local %s $context (with offset of %d+%d)\n", symbols + types[function.contextType].offsetToName, offset, function.argumentSize - NULLC_PTR_SIZE);
				char *ptr = GC::unmanageableBase + offset + function.argumentSize - NULLC_PTR_SIZE;
				GC::CheckPointer(ptr);
			}

			offset += stackSize;

			GC_DEBUG_PRINT("Moving offset to next frame by %d bytes\n", stackSize);
		}
	}

	// Check for pointers in stack
	char *tempStackBase = NULL, *tempStackTop = NULL;

#ifdef NULLC_BUILD_X86_JIT
	if(execID == NULLC_X86)
	{
		ExecutorX86 *exec = (ExecutorX86*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

#ifdef NULLC_LLVM_SUPPORT
	if(execID == NULLC_LLVM)
	{
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

	if(execID == NULLC_REG_VM)
	{
		ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}

	GC_DEBUG_PRINT("Check stack from %p to %p\n", tempStackBase, tempStackTop);

	// Check that temporary stack range is correct
	assert(tempStackTop >= tempStackBase);

	// Check temporary stack for pointers
	while(tempStackBase + sizeof(void*) <= tempStackTop)
	{
		char *ptr = GC::ReadVmMemoryPointer(tempStackBase);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(ptr > (char*)0x00010000 && (ptr < GC::unmanageableBase || ptr > GC::unmanageableTop))
		{
			// Get pointer base
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(ptr);
			// If there is no base, this pointer points to memory that is not GCs memory
			if(basePtr)
			{
				GC_DEBUG_PRINT("\tGlobal pointer [stack] %p\n", ptr);

				GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

				markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));

				// Might step on a left-over pointer in stale registers
				if(*marker & OBJECT_FREED)
				{
					tempStackBase += 4;
					continue;
				}

				GC::PrintMarker(*marker);

				// If block is unmarked, mark it as used
				if(!(*marker & OBJECT_VISIBLE))
				{
					*marker |= OBJECT_VISIBLE;

					GC_DEBUG_PRINT("\tMarked as used, checking content\n");

					GC::CheckBasePointer((char*)basePtr);
				}
			}
		}
		tempStackBase += 4;
	}

	GC::MarkPendingRoots();
}